

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_scroller.cpp
# Opt level: O0

void QtMWidgets::Scroller::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined4 *puVar1;
  code *pcVar2;
  QEasingCurve *pQVar3;
  uint uVar4;
  QEasingCurve *other;
  void *_v_1;
  Scroller *_t_2;
  void *_v;
  Scroller *_t_1;
  int *result;
  Scroller *_t;
  void **_a_local;
  int _id_local;
  Call _c_local;
  QObject *_o_local;
  
  if (_c == InvokeMetaMethod) {
    switch(_id) {
    case 0:
      scroll((Scroller *)_o,*_a[1],*_a[2]);
      break;
    case 1:
      aboutToStart((Scroller *)_o);
      break;
    case 2:
      finished((Scroller *)_o);
      break;
    case 3:
      _q_animation((Scroller *)_o,(QVariant *)_a[1]);
      break;
    case 4:
      _q_animationFinished((Scroller *)_o);
    }
  }
  else if (_c == IndexOfMethod) {
    puVar1 = (undefined4 *)*_a;
    pcVar2 = *_a[1];
    if (pcVar2 == scroll && (pcVar2 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0)) {
      *puVar1 = 0;
    }
    else {
      pcVar2 = *_a[1];
      if (pcVar2 == aboutToStart && (pcVar2 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0)) {
        *puVar1 = 1;
      }
      else {
        pcVar2 = *_a[1];
        if (pcVar2 == finished && (pcVar2 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0)) {
          *puVar1 = 2;
        }
      }
    }
  }
  else if (_c == ReadProperty) {
    pQVar3 = (QEasingCurve *)*_a;
    switch(_id) {
    case 0:
      uVar4 = minRecognizedVelocity((Scroller *)_o);
      *(uint *)&pQVar3->d_ptr = uVar4;
      break;
    case 1:
      uVar4 = maxReachedVelocity((Scroller *)_o);
      *(uint *)&pQVar3->d_ptr = uVar4;
      break;
    case 2:
      uVar4 = dragStartDistance((Scroller *)_o);
      *(uint *)&pQVar3->d_ptr = uVar4;
      break;
    case 3:
      uVar4 = scrollTime((Scroller *)_o);
      *(uint *)&pQVar3->d_ptr = uVar4;
      break;
    case 4:
      other = scrollingCurve((Scroller *)_o);
      QEasingCurve::operator=(pQVar3,other);
    }
  }
  else if (_c == WriteProperty) {
    pQVar3 = (QEasingCurve *)*_a;
    switch(_id) {
    case 0:
      setMinRecognizedVelocity((Scroller *)_o,*(uint *)&pQVar3->d_ptr);
      break;
    case 1:
      setMaxReachedVelocity((Scroller *)_o,*(uint *)&pQVar3->d_ptr);
      break;
    case 2:
      setDragStartDistance((Scroller *)_o,*(uint *)&pQVar3->d_ptr);
      break;
    case 3:
      setScrollTime((Scroller *)_o,*(uint *)&pQVar3->d_ptr);
      break;
    case 4:
      setScrollingCurve((Scroller *)_o,pQVar3);
    }
  }
  return;
}

Assistant:

void QtMWidgets::Scroller::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<Scroller *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->scroll((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 1: _t->aboutToStart(); break;
        case 2: _t->finished(); break;
        case 3: _t->_q_animation((*reinterpret_cast< std::add_pointer_t<QVariant>>(_a[1]))); break;
        case 4: _t->_q_animationFinished(); break;
        default: ;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (Scroller::*)(int , int );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&Scroller::scroll)) {
                *result = 0;
                return;
            }
        }
        {
            using _t = void (Scroller::*)();
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&Scroller::aboutToStart)) {
                *result = 1;
                return;
            }
        }
        {
            using _t = void (Scroller::*)();
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&Scroller::finished)) {
                *result = 2;
                return;
            }
        }
    }
#ifndef QT_NO_PROPERTIES
    else if (_c == QMetaObject::ReadProperty) {
        auto *_t = static_cast<Scroller *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast< uint*>(_v) = _t->minRecognizedVelocity(); break;
        case 1: *reinterpret_cast< uint*>(_v) = _t->maxReachedVelocity(); break;
        case 2: *reinterpret_cast< uint*>(_v) = _t->dragStartDistance(); break;
        case 3: *reinterpret_cast< uint*>(_v) = _t->scrollTime(); break;
        case 4: *reinterpret_cast< QEasingCurve*>(_v) = _t->scrollingCurve(); break;
        default: break;
        }
    } else if (_c == QMetaObject::WriteProperty) {
        auto *_t = static_cast<Scroller *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setMinRecognizedVelocity(*reinterpret_cast< uint*>(_v)); break;
        case 1: _t->setMaxReachedVelocity(*reinterpret_cast< uint*>(_v)); break;
        case 2: _t->setDragStartDistance(*reinterpret_cast< uint*>(_v)); break;
        case 3: _t->setScrollTime(*reinterpret_cast< uint*>(_v)); break;
        case 4: _t->setScrollingCurve(*reinterpret_cast< QEasingCurve*>(_v)); break;
        default: break;
        }
    } else if (_c == QMetaObject::ResetProperty) {
    } else if (_c == QMetaObject::BindableProperty) {
    }
#endif // QT_NO_PROPERTIES
}